

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint128.cpp
# Opt level: O1

maybe<unsigned_long,_void> *
anon_unknown.dwarf_2f631f::get64
          (maybe<unsigned_long,_void> *__return_storage_ptr__,string *str,uint index)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  type tVar4;
  maybe<unsigned_int,_void> in_RAX;
  uint *puVar5;
  type tVar6;
  int shift;
  long lVar7;
  maybe<unsigned_int,_void> digit;
  maybe<unsigned_int,_void> local_38;
  
  if (str->_M_string_length <= (ulong)index) {
    pstore::assert_failed
              ("index < str.length ()",
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/support/uint128.cpp"
               ,0x26);
  }
  lVar7 = 0x3c;
  tVar6 = (type)0x0;
  local_38 = in_RAX;
  do {
    cVar1 = (str->_M_dataplus)._M_p[index];
    iVar3 = (int)cVar1;
    if ((byte)(cVar1 + 0x9fU) < 6) {
      tVar4 = (type)(iVar3 + -0x57);
LAB_0013b412:
      local_38.valid_ = true;
      local_38.storage_ = tVar4;
    }
    else {
      if ((byte)(cVar1 + 0xbfU) < 6) {
        tVar4 = (type)(iVar3 + -0x37);
        goto LAB_0013b412;
      }
      if ((byte)(cVar1 - 0x30U) < 10) {
        tVar4 = (type)(iVar3 + -0x30);
        goto LAB_0013b412;
      }
      local_38.valid_ = false;
      local_38._1_3_ = 0;
      local_38.storage_ = (type)0x0;
    }
    bVar2 = local_38.valid_;
    if (local_38.valid_ == false) {
      *(undefined8 *)__return_storage_ptr__ = 0;
      __return_storage_ptr__->storage_ = (type)0x0;
    }
    else {
      puVar5 = pstore::maybe<unsigned_int,void>::
               value_impl<pstore::maybe<unsigned_int,void>const&,unsigned_int_const>(&local_38);
      tVar6.__data = tVar6.__data | (ulong)*puVar5 << ((byte)lVar7 & 0x3f);
    }
    if (local_38.valid_ == true) {
      local_38 = (maybe<unsigned_int,_void>)((ulong)local_38 & 0xffffffffffffff00);
    }
    if (bVar2 == false) {
      return __return_storage_ptr__;
    }
    lVar7 = lVar7 + -4;
    index = index + 1;
    if (lVar7 == -4) {
      __return_storage_ptr__->valid_ = true;
      __return_storage_ptr__->storage_ = tVar6;
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

maybe<std::uint64_t> get64 (std::string const & str, unsigned index) {
        PSTORE_ASSERT (index < str.length ());
        auto result = std::uint64_t{0};
        for (auto shift = 60; shift >= 0; shift -= 4, ++index) {
            auto const digit = hex_to_digit (str[index]);
            if (!digit) {
                return nothing<std::uint64_t> ();
            }
            result |=
                (static_cast<std::uint64_t> (digit.value ()) << static_cast<unsigned> (shift));
        }
        return just (result);
    }